

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ConstPasswdProxy *this;
  bool verify;
  PasswordProxy *proxy;
  char **argv_local;
  int argc_local;
  
  this = (ConstPasswdProxy *)operator_new(8);
  ConstPasswdProxy::ConstPasswdProxy(this);
  iVar1 = (*(this->super_PasswordProxy)._vptr_PasswordProxy[2])(this,"abc");
  printf("result: %d\n",(ulong)((byte)iVar1 & 1));
  iVar1 = (*(this->super_PasswordProxy)._vptr_PasswordProxy[2])(this,"1234");
  printf("result: %d\n",(ulong)((byte)iVar1 & 1));
  if (this != (ConstPasswdProxy *)0x0) {
    (*(this->super_PasswordProxy)._vptr_PasswordProxy[1])();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	PasswordProxy* proxy = new ConstPasswdProxy();

	bool verify = proxy->verify("abc");
	printf("result: %d\n", verify);

	verify = proxy->verify("1234");
	printf("result: %d\n", verify);

	delete proxy;

	return 0;
}